

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__get16le(stbi__context *s)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
LAB_0011aa6e:
    s->img_buffer = pbVar2 + 1;
    uVar3 = (uint)*pbVar2;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      goto LAB_0011aa6e;
    }
    uVar3 = 0;
  }
  pbVar2 = s->img_buffer;
  if (s->img_buffer_end <= pbVar2) {
    if (s->read_from_callbacks == 0) {
      uVar1 = 0;
      goto LAB_0011aab3;
    }
    stbi__refill_buffer(s);
    pbVar2 = s->img_buffer;
  }
  s->img_buffer = pbVar2 + 1;
  uVar1 = (uint)*pbVar2 << 8;
LAB_0011aab3:
  return uVar1 | uVar3;
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}